

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.cpp
# Opt level: O3

void __thiscall
Nova::Triangulated_Surface<float>::Initialize_Cylinder_Tessellation
          (Triangulated_Surface<float> *this,Cylinder<float> *cylinder,int m,int n,bool create_caps)

{
  Simplex_Mesh<3> *this_00;
  pointer pVVar1;
  pointer pVVar2;
  double dVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  undefined4 in_register_00000014;
  float fVar9;
  float fVar10;
  undefined3 in_register_00000081;
  float fVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector<float,_3,_true> data_copy;
  TV local_b0;
  float local_a4;
  int local_a0;
  float local_9c;
  ulong local_98;
  float local_90 [3];
  undefined4 local_84;
  undefined8 local_80;
  ulong local_78;
  double local_70;
  undefined1 local_68 [16];
  Triangulated_Surface<float> *local_58;
  ulong local_50;
  undefined1 local_48 [16];
  ulong local_38;
  
  local_84 = CONCAT31(in_register_00000081,create_caps);
  local_80 = CONCAT44(in_register_00000014,m);
  uVar12 = (ulong)(uint)n;
  pVVar1 = (this->super_Point_Cloud<float,_3>).points._data.
           super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Point_Cloud<float,_3>).points._data.
      super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->super_Point_Cloud<float,_3>).points._data.
    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar2 = (this->super_Simplex_Mesh<3>).elements._data.
           super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Simplex_Mesh<3>).elements._data.
      super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->super_Simplex_Mesh<3>).elements._data.
    super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  local_a0 = m + -1;
  if (0 < m) {
    local_a4 = (float)two_pi / (float)n;
    local_9c = *(float *)cylinder / (float)local_a0;
    local_98 = 1;
    do {
      if (0 < n) {
        local_78 = CONCAT44(local_78._4_4_,(float)((int)local_98 + -1) * local_9c);
        iVar13 = 1;
        do {
          local_68 = *(undefined1 (*) [16])(cylinder + 4);
          local_70 = (double)((float)(iVar13 + -1) * local_a4);
          dVar3 = sin(local_70);
          local_48._8_4_ = extraout_XMM0_Dc;
          local_48._0_8_ = dVar3;
          local_48._12_4_ = extraout_XMM0_Dd;
          auVar4._4_4_ = *(undefined4 *)(cylinder + 4);
          auVar4._0_4_ = local_68._0_4_;
          auVar4._8_4_ = local_68._4_4_;
          auVar4._12_4_ = 0;
          local_68 = auVar4;
          dVar3 = cos(local_70);
          local_90[0] = (float)local_78;
          local_90[1] = (float)(double)local_48._0_8_ * (float)local_68._0_4_;
          local_90[2] = (float)dVar3 * (float)local_68._4_4_;
          local_b0._data._M_elems._0_8_ = *(undefined8 *)(cylinder + 0x14);
          local_b0._data._M_elems[2] = *(float *)(cylinder + 0x1c);
          lVar6 = 0;
          do {
            *(float *)((long)local_b0._data._M_elems + lVar6) =
                 *(float *)((long)local_b0._data._M_elems + lVar6) +
                 *(float *)((long)local_90 + lVar6);
            lVar6 = lVar6 + 4;
          } while (lVar6 != 0xc);
          Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_b0);
          bVar14 = iVar13 != n;
          iVar13 = iVar13 + 1;
        } while (bVar14);
      }
      iVar13 = (int)local_98;
      local_98 = (ulong)(iVar13 + 1);
    } while (iVar13 != (int)local_80);
  }
  if ((char)local_84 != '\0') {
    local_90[2] = 0.0;
    local_90[0] = 0.0;
    local_90[1] = 0.0;
    local_b0._data._M_elems._0_8_ = *(undefined8 *)(cylinder + 0x14);
    local_b0._data._M_elems[2] = *(float *)(cylinder + 0x1c);
    lVar6 = 0;
    do {
      *(float *)((long)local_b0._data._M_elems + lVar6) =
           *(float *)((long)local_b0._data._M_elems + lVar6) + *(float *)((long)local_90 + lVar6);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xc);
    Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_b0);
    local_90[0] = *(float *)cylinder;
    local_90[1] = 0.0;
    local_90[2] = 0.0;
    local_b0._data._M_elems._0_8_ = *(undefined8 *)(cylinder + 0x14);
    local_b0._data._M_elems[2] = *(float *)(cylinder + 0x1c);
    lVar6 = 0;
    do {
      *(float *)((long)local_b0._data._M_elems + lVar6) =
           *(float *)((long)local_b0._data._M_elems + lVar6) + *(float *)((long)local_90 + lVar6);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xc);
    Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_b0);
  }
  local_58 = this;
  if (0 < n) {
    this_00 = &this->super_Simplex_Mesh<3>;
    local_98 = (ulong)(uint)(n * (int)local_80);
    local_9c = (float)(n * (int)local_80 + 1);
    local_38 = (ulong)(local_a0 * n - 1);
    local_a4 = 0.0;
    uVar7 = 1;
    local_50 = uVar12;
    do {
      uVar8 = (int)uVar7 + 1;
      local_48._0_8_ = uVar7;
      local_70 = (double)CONCAT44(local_70._4_4_,uVar8);
      if ((int)uVar7 == (int)uVar12) {
        uVar8 = 1;
      }
      local_78 = (ulong)uVar8;
      if (1 < (int)local_80) {
        iVar13 = local_a0;
        fVar9 = local_a4;
        fVar10 = (float)(uVar8 - 1);
        do {
          local_b0._data._M_elems[1] = (float)((int)uVar12 + (int)fVar9);
          local_68._0_4_ = local_b0._data._M_elems[1];
          fVar11 = (float)((int)local_50 + (int)fVar10);
          local_b0._data._M_elems[0] = fVar9;
          local_b0._data._M_elems[2] = fVar11;
          Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_b0);
          local_b0._data._M_elems[1] = fVar11;
          local_b0._data._M_elems[2] = fVar10;
          Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_b0);
          iVar13 = iVar13 + -1;
          uVar12 = local_50;
          fVar9 = (float)local_68._0_4_;
          fVar10 = fVar11;
        } while (iVar13 != 0);
      }
      iVar13 = local_48._0_4_;
      if ((char)local_84 != '\0') {
        iVar5 = (int)local_78;
        local_b0._data._M_elems[2] = (float)(iVar5 + -1);
        local_b0._data._M_elems[1] = (float)(iVar13 + -1);
        local_b0._data._M_elems[0] = (float)local_98;
        Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_b0);
        local_b0._data._M_elems[2] = (float)((int)local_38 + iVar13);
        local_b0._data._M_elems[1] = (float)(iVar5 + (int)local_38);
        local_b0._data._M_elems[0] = local_9c;
        Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_b0);
      }
      local_a4 = (float)((int)local_a4 + 1);
      uVar7 = (ulong)local_70 & 0xffffffff;
    } while (iVar13 != (int)uVar12);
  }
  (local_58->super_Simplex_Mesh<3>).number_of_nodes =
       ((long)(local_58->super_Point_Cloud<float,_3>).points._data.
              super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(local_58->super_Point_Cloud<float,_3>).points._data.
              super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  return;
}

Assistant:

void Nova::Triangulated_Surface<T>::
Initialize_Cylinder_Tessellation(const Cylinder<T>& cylinder,const int m,const int n,const bool create_caps)
{
    points.Clear();elements.Clear();

    T dtheta=(T)two_pi/n,dlength=cylinder.height/(m-1);
    for(int i=1;i<=m;++i) for(int j=1;j<=n;++j){T theta=(j-1)*dtheta;
        Add_Vertex(cylinder.plane1.x1+TV({dlength*(i-1),cylinder.radius*(T)sin(theta),cylinder.radius*(T)cos(theta)}));}
    if(create_caps){Add_Vertex(cylinder.plane1.x1+TV());Add_Vertex(cylinder.plane1.x1+TV({cylinder.height,0,0}));}

    for(int j=1;j<=n;++j){int j_1=j==n?1:j+1;
        for(int i=1;i<=m-1;++i){
            Add_Element(INDEX({j+(i-1)*n-1,j+i*n-1,j_1+i*n-1}));
            Add_Element(INDEX({j+(i-1)*n-1,j_1+i*n-1,j_1+(i-1)*n-1}));}
        if(create_caps){
            Add_Element(INDEX({m*n,j-1,j_1-1}));
            Add_Element(INDEX({m*n+1,j_1+(m-1)*n-1,j+(m-1)*n-1}));}}
    number_of_nodes=points.size();
}